

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StringGetcMethod::~StringGetcMethod(StringGetcMethod *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  return;
}

Assistant:

explicit StringGetcMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Getc, SubroutineKind::Function, 1,
                               {&builtins.intType}, builtins.byteType, true) {}